

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS
ref_mpi_allgatherv(REF_MPI ref_mpi,void *param_2,REF_INT *counts,void *concatenated_array,
                  REF_TYPE type)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  REF_STATUS RVar4;
  
  if (type == 3) {
    RVar4 = 0;
    uVar2 = (ulong)(uint)*counts;
    if (*counts < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      *(undefined8 *)((long)concatenated_array + uVar3 * 8) =
           *(undefined8 *)((long)param_2 + uVar3 * 8);
    }
  }
  else if (type == 2) {
    RVar4 = 0;
    uVar2 = (ulong)(uint)*counts;
    if (*counts < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      *(undefined8 *)((long)concatenated_array + uVar3 * 8) =
           *(undefined8 *)((long)param_2 + uVar3 * 8);
    }
  }
  else if (type == 1) {
    RVar4 = 0;
    for (lVar1 = 0; lVar1 < *counts; lVar1 = lVar1 + 1) {
      *(undefined4 *)((long)concatenated_array + lVar1 * 4) =
           *(undefined4 *)((long)param_2 + lVar1 * 4);
    }
  }
  else {
    RVar4 = 6;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x3ca,
           "ref_mpi_allgatherv",6,"data type");
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allgatherv(REF_MPI ref_mpi, void *local_array,
                                      REF_INT *counts, void *concatenated_array,
                                      REF_TYPE type) {
#ifdef HAVE_MPI
  REF_INT proc;
  REF_INT *displs;
  MPI_Datatype datatype;
  REF_INT i;
  ref_type_mpi_type(type, datatype);

  if (!ref_mpi_para(ref_mpi)) {
    switch (type) {
      case REF_INT_TYPE:
        for (i = 0; i < counts[0]; i++)
          ((REF_INT *)concatenated_array)[i] = ((REF_INT *)local_array)[i];
        break;
      case REF_LONG_TYPE:
        for (i = 0; i < counts[0]; i++)
          ((REF_LONG *)concatenated_array)[i] = ((REF_LONG *)local_array)[i];
        break;
      case REF_DBL_TYPE:
        for (i = 0; i < counts[0]; i++)
          ((REF_DBL *)concatenated_array)[i] = ((REF_DBL *)local_array)[i];
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
    return REF_SUCCESS;
  }

  ref_malloc(displs, ref_mpi_n(ref_mpi), REF_INT);

  displs[0] = 0;
  each_ref_mpi_worker(ref_mpi, proc) displs[proc] =
      displs[proc - 1] + counts[proc - 1];

  MPI_Allgatherv(local_array, counts[ref_mpi_rank(ref_mpi)], datatype,
                 concatenated_array, counts, displs, datatype,
                 ref_mpi_comm(ref_mpi));

  ref_free(displs);

#else
  REF_INT i;
  switch (type) {
    case REF_INT_TYPE:
      for (i = 0; i < counts[0]; i++)
        ((REF_INT *)concatenated_array)[i] = ((REF_INT *)local_array)[i];
      break;
    case REF_LONG_TYPE:
      for (i = 0; i < counts[0]; i++)
        ((REF_LONG *)concatenated_array)[i] = ((REF_LONG *)local_array)[i];
      break;
    case REF_DBL_TYPE:
      for (i = 0; i < counts[0]; i++)
        ((REF_DBL *)concatenated_array)[i] = ((REF_DBL *)local_array)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
#endif

  return REF_SUCCESS;
}